

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFunctionMapFactory.cpp
# Opt level: O0

ElementFunctionMap * COLLADASaxFWL14::FunctionMapFactory::createFunctionMap__COLLADA__1level(void)

{
  int iVar1;
  mapped_type *pmVar2;
  ElementValidateEndFunctionPtr in_R9;
  key_type *in_stack_fffffffffffff1a8;
  ElementFunctionMap *this;
  FunctionStruct local_de8;
  code *local_d88;
  undefined8 uStack_d80;
  code *local_d78;
  undefined8 uStack_d70;
  code *local_d68;
  undefined8 uStack_d60;
  code *local_d58;
  undefined8 uStack_d50;
  code *local_d48;
  undefined8 local_d40;
  code *local_d38;
  undefined8 local_d30;
  FunctionStruct local_d28;
  code *local_cc8;
  undefined8 uStack_cc0;
  code *local_cb8;
  undefined8 uStack_cb0;
  code *local_ca8;
  undefined8 uStack_ca0;
  code *local_c98;
  undefined8 uStack_c90;
  code *local_c88;
  undefined8 local_c80;
  code *local_c78;
  undefined8 local_c70;
  FunctionStruct local_c68;
  code *local_c08;
  undefined8 uStack_c00;
  code *local_bf8;
  undefined8 uStack_bf0;
  code *local_be8;
  undefined8 uStack_be0;
  code *local_bd8;
  undefined8 uStack_bd0;
  code *local_bc8;
  undefined8 local_bc0;
  code *local_bb8;
  undefined8 local_bb0;
  FunctionStruct local_ba8;
  code *local_b48;
  undefined8 uStack_b40;
  code *local_b38;
  undefined8 uStack_b30;
  code *local_b28;
  undefined8 uStack_b20;
  code *local_b18;
  undefined8 uStack_b10;
  code *local_b08;
  undefined8 local_b00;
  code *local_af8;
  undefined8 local_af0;
  FunctionStruct local_ae8;
  code *local_a88;
  undefined8 uStack_a80;
  code *local_a78;
  undefined8 uStack_a70;
  code *local_a68;
  undefined8 uStack_a60;
  code *local_a58;
  undefined8 uStack_a50;
  code *local_a48;
  undefined8 local_a40;
  code *local_a38;
  undefined8 local_a30;
  FunctionStruct local_a28;
  code *local_9c8;
  undefined8 uStack_9c0;
  code *local_9b8;
  undefined8 uStack_9b0;
  code *local_9a8;
  undefined8 uStack_9a0;
  code *local_998;
  undefined8 uStack_990;
  code *local_988;
  undefined8 local_980;
  code *local_978;
  undefined8 local_970;
  FunctionStruct local_968;
  code *local_908;
  undefined8 uStack_900;
  code *local_8f8;
  undefined8 uStack_8f0;
  code *local_8e8;
  undefined8 uStack_8e0;
  code *local_8d8;
  undefined8 uStack_8d0;
  code *local_8c8;
  undefined8 local_8c0;
  code *local_8b8;
  undefined8 local_8b0;
  FunctionStruct local_8a8;
  code *local_848;
  undefined8 uStack_840;
  code *local_838;
  undefined8 uStack_830;
  code *local_828;
  undefined8 uStack_820;
  code *local_818;
  undefined8 uStack_810;
  code *local_808;
  undefined8 local_800;
  code *local_7f8;
  undefined8 local_7f0;
  FunctionStruct local_7e8;
  code *local_788;
  undefined8 uStack_780;
  code *local_778;
  undefined8 uStack_770;
  code *local_768;
  undefined8 uStack_760;
  code *local_758;
  undefined8 uStack_750;
  code *local_748;
  undefined8 local_740;
  code *local_738;
  undefined8 local_730;
  FunctionStruct local_728;
  code *local_6c8;
  undefined8 uStack_6c0;
  code *local_6b8;
  undefined8 uStack_6b0;
  code *local_6a8;
  undefined8 uStack_6a0;
  code *local_698;
  undefined8 uStack_690;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  undefined8 local_670;
  FunctionStruct local_668;
  code *local_608;
  undefined8 uStack_600;
  code *local_5f8;
  undefined8 uStack_5f0;
  code *local_5e8;
  undefined8 uStack_5e0;
  code *local_5d8;
  undefined8 uStack_5d0;
  code *local_5c8;
  undefined8 local_5c0;
  code *local_5b8;
  undefined8 local_5b0;
  FunctionStruct local_5a8;
  code *local_548;
  undefined8 uStack_540;
  code *local_538;
  undefined8 uStack_530;
  code *local_528;
  undefined8 uStack_520;
  code *local_518;
  undefined8 uStack_510;
  code *local_508;
  undefined8 local_500;
  code *local_4f8;
  undefined8 local_4f0;
  FunctionStruct local_4e8;
  code *local_488;
  undefined8 uStack_480;
  code *local_478;
  undefined8 uStack_470;
  code *local_468;
  undefined8 uStack_460;
  code *local_458;
  undefined8 uStack_450;
  code *local_448;
  undefined8 local_440;
  code *local_438;
  undefined8 local_430;
  FunctionStruct local_428;
  code *local_3c8;
  undefined8 uStack_3c0;
  code *local_3b8;
  undefined8 uStack_3b0;
  code *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  undefined8 uStack_390;
  code *local_388;
  undefined8 local_380;
  code *local_378;
  undefined8 local_370;
  FunctionStruct local_368;
  code *local_308;
  undefined8 uStack_300;
  code *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  undefined8 uStack_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  undefined8 local_2b0;
  FunctionStruct local_2a8;
  code *local_248;
  undefined8 uStack_240;
  code *local_238;
  undefined8 uStack_230;
  code *local_228;
  undefined8 uStack_220;
  code *local_218;
  undefined8 uStack_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  undefined8 local_1f0;
  FunctionStruct local_1e8;
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  undefined8 uStack_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  FunctionStruct local_128;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  FunctionStruct local_68;
  
  if (createFunctionMap__COLLADA__1level()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__COLLADA__1level()::functionMap);
    if (iVar1 != 0) {
      std::
      map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
      ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             *)0x79e7be);
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__COLLADA__1level::functionMap,&__dso_handle);
      __cxa_guard_release(&createFunctionMap__COLLADA__1level()::functionMap);
    }
  }
  if ((createFunctionMap__COLLADA__1level::mapFilled & 1U) == 0) {
    local_78 = ColladaParserAutoGen14Private::_begin__COLLADA;
    local_70 = 0;
    local_88 = ColladaParserAutoGen14Private::_data__COLLADA;
    local_80 = 0;
    local_98 = ColladaParserAutoGen14Private::_end__COLLADA;
    uStack_90 = 0;
    local_a8 = ColladaParserAutoGen14Private::_preBegin__COLLADA;
    uStack_a0 = 0;
    local_b8 = ColladaParserAutoGen14Private::_preEnd__COLLADA;
    uStack_b0 = 0;
    local_c8 = ColladaParserAutoGen14Private::_freeAttributes__COLLADA;
    uStack_c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_68,0x84d880,0,0x85c460,0,in_R9,0x84d8b0);
    this = &createFunctionMap__COLLADA__1level::functionMap;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__COLLADA__1level::functionMap,in_stack_fffffffffffff1a8
                         );
    pmVar2->freeAttributesFunction = local_68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_68._88_8_;
    pmVar2->validateEndFunction = local_68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_68._72_8_;
    pmVar2->validateBeginFunction = local_68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_68._56_8_;
    pmVar2->endFunction = local_68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_68._40_8_;
    pmVar2->textDataFunction = local_68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_68._24_8_;
    pmVar2->beginFunction = local_68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_68._8_8_;
    local_138 = ColladaParserAutoGen14Private::_begin__asset;
    local_130 = 0;
    local_148 = ColladaParserAutoGen14Private::_data__asset;
    local_140 = 0;
    local_158 = ColladaParserAutoGen14Private::_end__asset;
    uStack_150 = 0;
    local_168 = ColladaParserAutoGen14Private::_preBegin__asset;
    uStack_160 = 0;
    local_178 = ColladaParserAutoGen14Private::_preEnd__asset;
    uStack_170 = 0;
    local_188 = ColladaParserAutoGen14Private::_freeAttributes__asset;
    uStack_180 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_128,0x84db00,0,0x85ca40,0,in_R9,0x84db30);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_128.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_128._88_8_;
    pmVar2->validateEndFunction = local_128.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_128._72_8_;
    pmVar2->validateBeginFunction = local_128.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_128._56_8_;
    pmVar2->endFunction = local_128.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_128._40_8_;
    pmVar2->textDataFunction = local_128.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_128._24_8_;
    pmVar2->beginFunction = local_128.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_128._8_8_;
    local_1f8 = ColladaParserAutoGen14Private::_begin__extra;
    local_1f0 = 0;
    local_208 = ColladaParserAutoGen14Private::_data__extra;
    local_200 = 0;
    local_218 = ColladaParserAutoGen14Private::_end__extra;
    uStack_210 = 0;
    local_228 = ColladaParserAutoGen14Private::_preBegin__extra;
    uStack_220 = 0;
    local_238 = ColladaParserAutoGen14Private::_preEnd__extra;
    uStack_230 = 0;
    local_248 = ColladaParserAutoGen14Private::_freeAttributes__extra;
    uStack_240 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1e8,0x84db50,0,0x85fb30,0,in_R9,0x84db80);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_1e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1e8._88_8_;
    pmVar2->validateEndFunction = local_1e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1e8._72_8_;
    pmVar2->validateBeginFunction = local_1e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1e8._56_8_;
    pmVar2->endFunction = local_1e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1e8._40_8_;
    pmVar2->textDataFunction = local_1e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1e8._24_8_;
    pmVar2->beginFunction = local_1e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1e8._8_8_;
    local_2b8 = ColladaParserAutoGen14Private::_begin__library_animation_clips;
    local_2b0 = 0;
    local_2c8 = ColladaParserAutoGen14Private::_data__library_animation_clips;
    local_2c0 = 0;
    local_2d8 = ColladaParserAutoGen14Private::_end__library_animation_clips;
    uStack_2d0 = 0;
    local_2e8 = ColladaParserAutoGen14Private::_preBegin__library_animation_clips;
    uStack_2e0 = 0;
    local_2f8 = ColladaParserAutoGen14Private::_preEnd__library_animation_clips;
    uStack_2f0 = 0;
    local_308 = ColladaParserAutoGen14Private::_freeAttributes__library_animation_clips;
    uStack_300 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2a8,0x84dba0,0,0x85fce0,0,in_R9,0x84dbd0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_2a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2a8._88_8_;
    pmVar2->validateEndFunction = local_2a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2a8._72_8_;
    pmVar2->validateBeginFunction = local_2a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2a8._56_8_;
    pmVar2->endFunction = local_2a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2a8._40_8_;
    pmVar2->textDataFunction = local_2a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2a8._24_8_;
    pmVar2->beginFunction = local_2a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2a8._8_8_;
    local_378 = ColladaParserAutoGen14Private::_begin__library_animations;
    local_370 = 0;
    local_388 = ColladaParserAutoGen14Private::_data__library_animations;
    local_380 = 0;
    local_398 = ColladaParserAutoGen14Private::_end__library_animations;
    uStack_390 = 0;
    local_3a8 = ColladaParserAutoGen14Private::_preBegin__library_animations;
    uStack_3a0 = 0;
    local_3b8 = ColladaParserAutoGen14Private::_preEnd__library_animations;
    uStack_3b0 = 0;
    local_3c8 = ColladaParserAutoGen14Private::_freeAttributes__library_animations;
    uStack_3c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_368,0x84dbf0,0,0x85d890,0,in_R9,0x84dc20);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_368.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_368._88_8_;
    pmVar2->validateEndFunction = local_368.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_368._72_8_;
    pmVar2->validateBeginFunction = local_368.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_368._56_8_;
    pmVar2->endFunction = local_368.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_368._40_8_;
    pmVar2->textDataFunction = local_368.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_368._24_8_;
    pmVar2->beginFunction = local_368.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_368._8_8_;
    local_438 = ColladaParserAutoGen14Private::_begin__library_cameras;
    local_430 = 0;
    local_448 = ColladaParserAutoGen14Private::_data__library_cameras;
    local_440 = 0;
    local_458 = ColladaParserAutoGen14Private::_end__library_cameras;
    uStack_450 = 0;
    local_468 = ColladaParserAutoGen14Private::_preBegin__library_cameras;
    uStack_460 = 0;
    local_478 = ColladaParserAutoGen14Private::_preEnd__library_cameras;
    uStack_470 = 0;
    local_488 = ColladaParserAutoGen14Private::_freeAttributes__library_cameras;
    uStack_480 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_428,0x84dc40,0,0x860490,0,in_R9,0x84dc70);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_428.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_428._88_8_;
    pmVar2->validateEndFunction = local_428.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_428._72_8_;
    pmVar2->validateBeginFunction = local_428.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_428._56_8_;
    pmVar2->endFunction = local_428.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_428._40_8_;
    pmVar2->textDataFunction = local_428.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_428._24_8_;
    pmVar2->beginFunction = local_428.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_428._8_8_;
    local_4f8 = ColladaParserAutoGen14Private::_begin__library_controllers;
    local_4f0 = 0;
    local_508 = ColladaParserAutoGen14Private::_data__library_controllers;
    local_500 = 0;
    local_518 = ColladaParserAutoGen14Private::_end__library_controllers;
    uStack_510 = 0;
    local_528 = ColladaParserAutoGen14Private::_preBegin__library_controllers;
    uStack_520 = 0;
    local_538 = ColladaParserAutoGen14Private::_preEnd__library_controllers;
    uStack_530 = 0;
    local_548 = ColladaParserAutoGen14Private::_freeAttributes__library_controllers;
    uStack_540 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4e8,0x84dc90,0,0x861f70,0,in_R9,0x84dcc0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_4e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4e8._88_8_;
    pmVar2->validateEndFunction = local_4e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4e8._72_8_;
    pmVar2->validateBeginFunction = local_4e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4e8._56_8_;
    pmVar2->endFunction = local_4e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4e8._40_8_;
    pmVar2->textDataFunction = local_4e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4e8._24_8_;
    pmVar2->beginFunction = local_4e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4e8._8_8_;
    local_5b8 = ColladaParserAutoGen14Private::_begin__library_effects;
    local_5b0 = 0;
    local_5c8 = ColladaParserAutoGen14Private::_data__library_effects;
    local_5c0 = 0;
    local_5d8 = ColladaParserAutoGen14Private::_end__library_effects;
    uStack_5d0 = 0;
    local_5e8 = ColladaParserAutoGen14Private::_preBegin__library_effects;
    uStack_5e0 = 0;
    local_5f8 = ColladaParserAutoGen14Private::_preEnd__library_effects;
    uStack_5f0 = 0;
    local_608 = ColladaParserAutoGen14Private::_freeAttributes__library_effects;
    uStack_600 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_5a8,0x84dce0,0,0x865050,0,in_R9,0x84dd10);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_5a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_5a8._88_8_;
    pmVar2->validateEndFunction = local_5a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_5a8._72_8_;
    pmVar2->validateBeginFunction = local_5a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_5a8._56_8_;
    pmVar2->endFunction = local_5a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_5a8._40_8_;
    pmVar2->textDataFunction = local_5a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_5a8._24_8_;
    pmVar2->beginFunction = local_5a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_5a8._8_8_;
    local_678 = ColladaParserAutoGen14Private::_begin__library_force_fields;
    local_670 = 0;
    local_688 = ColladaParserAutoGen14Private::_data__library_force_fields;
    local_680 = 0;
    local_698 = ColladaParserAutoGen14Private::_end__library_force_fields;
    uStack_690 = 0;
    local_6a8 = ColladaParserAutoGen14Private::_preBegin__library_force_fields;
    uStack_6a0 = 0;
    local_6b8 = ColladaParserAutoGen14Private::_preEnd__library_force_fields;
    uStack_6b0 = 0;
    local_6c8 = ColladaParserAutoGen14Private::_freeAttributes__library_force_fields;
    uStack_6c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_668,0x84dd30,0,0x86c8f0,0,in_R9,0x84dd60);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_668.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_668._88_8_;
    pmVar2->validateEndFunction = local_668.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_668._72_8_;
    pmVar2->validateBeginFunction = local_668.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_668._56_8_;
    pmVar2->endFunction = local_668.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_668._40_8_;
    pmVar2->textDataFunction = local_668.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_668._24_8_;
    pmVar2->beginFunction = local_668.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_668._8_8_;
    local_738 = ColladaParserAutoGen14Private::_begin__library_geometries;
    local_730 = 0;
    local_748 = ColladaParserAutoGen14Private::_data__library_geometries;
    local_740 = 0;
    local_758 = ColladaParserAutoGen14Private::_end__library_geometries;
    uStack_750 = 0;
    local_768 = ColladaParserAutoGen14Private::_preBegin__library_geometries;
    uStack_760 = 0;
    local_778 = ColladaParserAutoGen14Private::_preEnd__library_geometries;
    uStack_770 = 0;
    local_788 = ColladaParserAutoGen14Private::_freeAttributes__library_geometries;
    uStack_780 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_728,0x84dd80,0,0x8633d0,0,in_R9,0x84ddb0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_728.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_728._88_8_;
    pmVar2->validateEndFunction = local_728.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_728._72_8_;
    pmVar2->validateBeginFunction = local_728.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_728._56_8_;
    pmVar2->endFunction = local_728.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_728._40_8_;
    pmVar2->textDataFunction = local_728.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_728._24_8_;
    pmVar2->beginFunction = local_728.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_728._8_8_;
    local_7f8 = ColladaParserAutoGen14Private::_begin__library_images;
    local_7f0 = 0;
    local_808 = ColladaParserAutoGen14Private::_data__library_images;
    local_800 = 0;
    local_818 = ColladaParserAutoGen14Private::_end__library_images;
    uStack_810 = 0;
    local_828 = ColladaParserAutoGen14Private::_preBegin__library_images;
    uStack_820 = 0;
    local_838 = ColladaParserAutoGen14Private::_preEnd__library_images;
    uStack_830 = 0;
    local_848 = ColladaParserAutoGen14Private::_freeAttributes__library_images;
    uStack_840 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_7e8,0x84ddd0,0,0x86cc10,0,in_R9,0x84de00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_7e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_7e8._88_8_;
    pmVar2->validateEndFunction = local_7e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_7e8._72_8_;
    pmVar2->validateBeginFunction = local_7e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_7e8._56_8_;
    pmVar2->endFunction = local_7e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_7e8._40_8_;
    pmVar2->textDataFunction = local_7e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_7e8._24_8_;
    pmVar2->beginFunction = local_7e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_7e8._8_8_;
    local_8b8 = ColladaParserAutoGen14Private::_begin__library_lights;
    local_8b0 = 0;
    local_8c8 = ColladaParserAutoGen14Private::_data__library_lights;
    local_8c0 = 0;
    local_8d8 = ColladaParserAutoGen14Private::_end__library_lights;
    uStack_8d0 = 0;
    local_8e8 = ColladaParserAutoGen14Private::_preBegin__library_lights;
    uStack_8e0 = 0;
    local_8f8 = ColladaParserAutoGen14Private::_preEnd__library_lights;
    uStack_8f0 = 0;
    local_908 = ColladaParserAutoGen14Private::_freeAttributes__library_lights;
    uStack_900 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_8a8,0x84de20,0,0x86cda0,0,in_R9,0x84de50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_8a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_8a8._88_8_;
    pmVar2->validateEndFunction = local_8a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_8a8._72_8_;
    pmVar2->validateBeginFunction = local_8a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_8a8._56_8_;
    pmVar2->endFunction = local_8a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_8a8._40_8_;
    pmVar2->textDataFunction = local_8a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_8a8._24_8_;
    pmVar2->beginFunction = local_8a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_8a8._8_8_;
    local_978 = ColladaParserAutoGen14Private::_begin__library_materials;
    local_970 = 0;
    local_988 = ColladaParserAutoGen14Private::_data__library_materials;
    local_980 = 0;
    local_998 = ColladaParserAutoGen14Private::_end__library_materials;
    uStack_990 = 0;
    local_9a8 = ColladaParserAutoGen14Private::_preBegin__library_materials;
    uStack_9a0 = 0;
    local_9b8 = ColladaParserAutoGen14Private::_preEnd__library_materials;
    uStack_9b0 = 0;
    local_9c8 = ColladaParserAutoGen14Private::_freeAttributes__library_materials;
    uStack_9c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_968,0x84de70,0,0x86e400,0,in_R9,0x84dea0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_968.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_968._88_8_;
    pmVar2->validateEndFunction = local_968.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_968._72_8_;
    pmVar2->validateBeginFunction = local_968.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_968._56_8_;
    pmVar2->endFunction = local_968.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_968._40_8_;
    pmVar2->textDataFunction = local_968.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_968._24_8_;
    pmVar2->beginFunction = local_968.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_968._8_8_;
    local_a38 = ColladaParserAutoGen14Private::_begin__library_nodes;
    local_a30 = 0;
    local_a48 = ColladaParserAutoGen14Private::_data__library_nodes;
    local_a40 = 0;
    local_a58 = ColladaParserAutoGen14Private::_end__library_nodes;
    uStack_a50 = 0;
    local_a68 = ColladaParserAutoGen14Private::_preBegin__library_nodes;
    uStack_a60 = 0;
    local_a78 = ColladaParserAutoGen14Private::_preEnd__library_nodes;
    uStack_a70 = 0;
    local_a88 = ColladaParserAutoGen14Private::_freeAttributes__library_nodes;
    uStack_a80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_a28,0x84dec0,0,0x86ee60,0,in_R9,0x84def0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_a28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_a28._88_8_;
    pmVar2->validateEndFunction = local_a28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_a28._72_8_;
    pmVar2->validateBeginFunction = local_a28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_a28._56_8_;
    pmVar2->endFunction = local_a28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_a28._40_8_;
    pmVar2->textDataFunction = local_a28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_a28._24_8_;
    pmVar2->beginFunction = local_a28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_a28._8_8_;
    local_af8 = ColladaParserAutoGen14Private::_begin__library_physics_materials;
    local_af0 = 0;
    local_b08 = ColladaParserAutoGen14Private::_data__library_physics_materials;
    local_b00 = 0;
    local_b18 = ColladaParserAutoGen14Private::_end__library_physics_materials;
    uStack_b10 = 0;
    local_b28 = ColladaParserAutoGen14Private::_preBegin__library_physics_materials;
    uStack_b20 = 0;
    local_b38 = ColladaParserAutoGen14Private::_preEnd__library_physics_materials;
    uStack_b30 = 0;
    local_b48 = ColladaParserAutoGen14Private::_freeAttributes__library_physics_materials;
    uStack_b40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ae8,0x84df10,0,0x871e10,0,in_R9,0x84df40);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_ae8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ae8._88_8_;
    pmVar2->validateEndFunction = local_ae8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ae8._72_8_;
    pmVar2->validateBeginFunction = local_ae8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ae8._56_8_;
    pmVar2->endFunction = local_ae8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ae8._40_8_;
    pmVar2->textDataFunction = local_ae8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ae8._24_8_;
    pmVar2->beginFunction = local_ae8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ae8._8_8_;
    local_bb8 = ColladaParserAutoGen14Private::_begin__library_physics_models;
    local_bb0 = 0;
    local_bc8 = ColladaParserAutoGen14Private::_data__library_physics_models;
    local_bc0 = 0;
    local_bd8 = ColladaParserAutoGen14Private::_end__library_physics_models;
    uStack_bd0 = 0;
    local_be8 = ColladaParserAutoGen14Private::_preBegin__library_physics_models;
    uStack_be0 = 0;
    local_bf8 = ColladaParserAutoGen14Private::_preEnd__library_physics_models;
    uStack_bf0 = 0;
    local_c08 = ColladaParserAutoGen14Private::_freeAttributes__library_physics_models;
    uStack_c00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ba8,0x84df60,0,0x872af0,0,in_R9,0x84df90);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_ba8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ba8._88_8_;
    pmVar2->validateEndFunction = local_ba8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ba8._72_8_;
    pmVar2->validateBeginFunction = local_ba8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ba8._56_8_;
    pmVar2->endFunction = local_ba8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ba8._40_8_;
    pmVar2->textDataFunction = local_ba8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ba8._24_8_;
    pmVar2->beginFunction = local_ba8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ba8._8_8_;
    local_c78 = ColladaParserAutoGen14Private::_begin__library_physics_scenes;
    local_c70 = 0;
    local_c88 = ColladaParserAutoGen14Private::_data__library_physics_scenes;
    local_c80 = 0;
    local_c98 = ColladaParserAutoGen14Private::_end__library_physics_scenes;
    uStack_c90 = 0;
    local_ca8 = ColladaParserAutoGen14Private::_preBegin__library_physics_scenes;
    uStack_ca0 = 0;
    local_cb8 = ColladaParserAutoGen14Private::_preEnd__library_physics_scenes;
    uStack_cb0 = 0;
    local_cc8 = ColladaParserAutoGen14Private::_freeAttributes__library_physics_scenes;
    uStack_cc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_c68,0x84dfb0,0,0x8782e0,0,in_R9,0x84dfe0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_c68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_c68._88_8_;
    pmVar2->validateEndFunction = local_c68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_c68._72_8_;
    pmVar2->validateBeginFunction = local_c68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_c68._56_8_;
    pmVar2->endFunction = local_c68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_c68._40_8_;
    pmVar2->textDataFunction = local_c68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_c68._24_8_;
    pmVar2->beginFunction = local_c68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_c68._8_8_;
    local_d38 = ColladaParserAutoGen14Private::_begin__library_visual_scenes;
    local_d30 = 0;
    local_d48 = ColladaParserAutoGen14Private::_data__library_visual_scenes;
    local_d40 = 0;
    local_d58 = ColladaParserAutoGen14Private::_end__library_visual_scenes;
    uStack_d50 = 0;
    local_d68 = ColladaParserAutoGen14Private::_preBegin__library_visual_scenes;
    uStack_d60 = 0;
    local_d78 = ColladaParserAutoGen14Private::_preEnd__library_visual_scenes;
    uStack_d70 = 0;
    local_d88 = ColladaParserAutoGen14Private::_freeAttributes__library_visual_scenes;
    uStack_d80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_d28,0x84e000,0,0x878b40,0,in_R9,0x84e030);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    pmVar2->freeAttributesFunction = local_d28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_d28._88_8_;
    pmVar2->validateEndFunction = local_d28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_d28._72_8_;
    pmVar2->validateBeginFunction = local_d28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_d28._56_8_;
    pmVar2->endFunction = local_d28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_d28._40_8_;
    pmVar2->textDataFunction = local_d28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_d28._24_8_;
    pmVar2->beginFunction = local_d28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_d28._8_8_;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_de8,0x84e050,0,0x8794d0,0,0x879520,0x84e080);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](this,in_stack_fffffffffffff1a8);
    memcpy(pmVar2,&local_de8,0x60);
    createFunctionMap__COLLADA__1level::mapFilled = true;
  }
  return &createFunctionMap__COLLADA__1level::functionMap;
}

Assistant:

const ColladaParserAutoGen14Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__COLLADA__1level() {
static ColladaParserAutoGen14Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__COLLADA, &ColladaParserAutoGen14Private::_data__COLLADA, &ColladaParserAutoGen14Private::_end__COLLADA, &ColladaParserAutoGen14Private::_preBegin__COLLADA, &ColladaParserAutoGen14Private::_preEnd__COLLADA, &ColladaParserAutoGen14Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__asset, &ColladaParserAutoGen14Private::_data__asset, &ColladaParserAutoGen14Private::_end__asset, &ColladaParserAutoGen14Private::_preBegin__asset, &ColladaParserAutoGen14Private::_preEnd__asset, &ColladaParserAutoGen14Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATION_CLIPS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_animation_clips, &ColladaParserAutoGen14Private::_data__library_animation_clips, &ColladaParserAutoGen14Private::_end__library_animation_clips, &ColladaParserAutoGen14Private::_preBegin__library_animation_clips, &ColladaParserAutoGen14Private::_preEnd__library_animation_clips, &ColladaParserAutoGen14Private::_freeAttributes__library_animation_clips);
functionMap[HASH_ELEMENT_LIBRARY_ANIMATIONS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_animations, &ColladaParserAutoGen14Private::_data__library_animations, &ColladaParserAutoGen14Private::_end__library_animations, &ColladaParserAutoGen14Private::_preBegin__library_animations, &ColladaParserAutoGen14Private::_preEnd__library_animations, &ColladaParserAutoGen14Private::_freeAttributes__library_animations);
functionMap[HASH_ELEMENT_LIBRARY_CAMERAS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_cameras, &ColladaParserAutoGen14Private::_data__library_cameras, &ColladaParserAutoGen14Private::_end__library_cameras, &ColladaParserAutoGen14Private::_preBegin__library_cameras, &ColladaParserAutoGen14Private::_preEnd__library_cameras, &ColladaParserAutoGen14Private::_freeAttributes__library_cameras);
functionMap[HASH_ELEMENT_LIBRARY_CONTROLLERS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_controllers, &ColladaParserAutoGen14Private::_data__library_controllers, &ColladaParserAutoGen14Private::_end__library_controllers, &ColladaParserAutoGen14Private::_preBegin__library_controllers, &ColladaParserAutoGen14Private::_preEnd__library_controllers, &ColladaParserAutoGen14Private::_freeAttributes__library_controllers);
functionMap[HASH_ELEMENT_LIBRARY_EFFECTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_effects, &ColladaParserAutoGen14Private::_data__library_effects, &ColladaParserAutoGen14Private::_end__library_effects, &ColladaParserAutoGen14Private::_preBegin__library_effects, &ColladaParserAutoGen14Private::_preEnd__library_effects, &ColladaParserAutoGen14Private::_freeAttributes__library_effects);
functionMap[HASH_ELEMENT_LIBRARY_FORCE_FIELDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_force_fields, &ColladaParserAutoGen14Private::_data__library_force_fields, &ColladaParserAutoGen14Private::_end__library_force_fields, &ColladaParserAutoGen14Private::_preBegin__library_force_fields, &ColladaParserAutoGen14Private::_preEnd__library_force_fields, &ColladaParserAutoGen14Private::_freeAttributes__library_force_fields);
functionMap[HASH_ELEMENT_LIBRARY_GEOMETRIES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_geometries, &ColladaParserAutoGen14Private::_data__library_geometries, &ColladaParserAutoGen14Private::_end__library_geometries, &ColladaParserAutoGen14Private::_preBegin__library_geometries, &ColladaParserAutoGen14Private::_preEnd__library_geometries, &ColladaParserAutoGen14Private::_freeAttributes__library_geometries);
functionMap[HASH_ELEMENT_LIBRARY_IMAGES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_images, &ColladaParserAutoGen14Private::_data__library_images, &ColladaParserAutoGen14Private::_end__library_images, &ColladaParserAutoGen14Private::_preBegin__library_images, &ColladaParserAutoGen14Private::_preEnd__library_images, &ColladaParserAutoGen14Private::_freeAttributes__library_images);
functionMap[HASH_ELEMENT_LIBRARY_LIGHTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_lights, &ColladaParserAutoGen14Private::_data__library_lights, &ColladaParserAutoGen14Private::_end__library_lights, &ColladaParserAutoGen14Private::_preBegin__library_lights, &ColladaParserAutoGen14Private::_preEnd__library_lights, &ColladaParserAutoGen14Private::_freeAttributes__library_lights);
functionMap[HASH_ELEMENT_LIBRARY_MATERIALS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_materials, &ColladaParserAutoGen14Private::_data__library_materials, &ColladaParserAutoGen14Private::_end__library_materials, &ColladaParserAutoGen14Private::_preBegin__library_materials, &ColladaParserAutoGen14Private::_preEnd__library_materials, &ColladaParserAutoGen14Private::_freeAttributes__library_materials);
functionMap[HASH_ELEMENT_LIBRARY_NODES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_nodes, &ColladaParserAutoGen14Private::_data__library_nodes, &ColladaParserAutoGen14Private::_end__library_nodes, &ColladaParserAutoGen14Private::_preBegin__library_nodes, &ColladaParserAutoGen14Private::_preEnd__library_nodes, &ColladaParserAutoGen14Private::_freeAttributes__library_nodes);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MATERIALS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_materials, &ColladaParserAutoGen14Private::_data__library_physics_materials, &ColladaParserAutoGen14Private::_end__library_physics_materials, &ColladaParserAutoGen14Private::_preBegin__library_physics_materials, &ColladaParserAutoGen14Private::_preEnd__library_physics_materials, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_materials);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MODELS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_models, &ColladaParserAutoGen14Private::_data__library_physics_models, &ColladaParserAutoGen14Private::_end__library_physics_models, &ColladaParserAutoGen14Private::_preBegin__library_physics_models, &ColladaParserAutoGen14Private::_preEnd__library_physics_models, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_models);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_SCENES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_scenes, &ColladaParserAutoGen14Private::_data__library_physics_scenes, &ColladaParserAutoGen14Private::_end__library_physics_scenes, &ColladaParserAutoGen14Private::_preBegin__library_physics_scenes, &ColladaParserAutoGen14Private::_preEnd__library_physics_scenes, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_scenes);
functionMap[HASH_ELEMENT_LIBRARY_VISUAL_SCENES] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_visual_scenes, &ColladaParserAutoGen14Private::_data__library_visual_scenes, &ColladaParserAutoGen14Private::_end__library_visual_scenes, &ColladaParserAutoGen14Private::_preBegin__library_visual_scenes, &ColladaParserAutoGen14Private::_preEnd__library_visual_scenes, &ColladaParserAutoGen14Private::_freeAttributes__library_visual_scenes);
functionMap[HASH_ELEMENT_SCENE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__scene, &ColladaParserAutoGen14Private::_data__scene, &ColladaParserAutoGen14Private::_end__scene, &ColladaParserAutoGen14Private::_preBegin__scene, &ColladaParserAutoGen14Private::_preEnd__scene, &ColladaParserAutoGen14Private::_freeAttributes__scene);
mapFilled = true;
}
return functionMap;
}